

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
::unchecked_emplace_with_rehash<slang::BufferID>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<slang::BufferID>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<slang::BufferID>_>
          *this,size_t hash,BufferID *args)

{
  size_t *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  arrays_type new_arrays_;
  locator local_60;
  arrays_type local_48;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->size_ctrl).size;
  auVar3._8_8_ = 0x41;
  auVar3._0_8_ = 0xc9714fbcda3ac11;
  fVar4 = ceilf((float)((SUB168(auVar2 * auVar3,8) >> 6) + 1) / 0.875);
  table_arrays<slang::BufferID,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<slang::BufferID>_>
  ::new_(&local_48,&local_60,(long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p = (BufferID *)0x0;
  nosize_unchecked_emplace_at<slang::BufferID>
            (&local_60,this,&local_48,hash >> ((byte)local_48.groups_size_index & 0x3f),hash,args);
  __return_storage_ptr__->p = local_60.p;
  __return_storage_ptr__->pg = local_60.pg;
  __return_storage_ptr__->n = local_60.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_60._12_4_;
  unchecked_rehash(this,&local_48);
  psVar1 = &(this->size_ctrl).size;
  *psVar1 = *psVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }